

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O2

CfgNode * CFGReader::nodeWithAddr(CFG *cfg,Addr addr)

{
  uint __line;
  CfgNode *this;
  Data *data;
  char *__assertion;
  
  if (cfg == (CFG *)0x0) {
    __assertion = "cfg != 0";
    __line = 0x53;
  }
  else {
    if (addr != 0) {
      this = CFG::nodeByAddr(cfg,addr);
      if (this == (CfgNode *)0x0) {
        this = (CfgNode *)operator_new(0x18);
        CfgNode::CfgNode(this,CFG_PHANTOM);
        data = (Data *)operator_new(0x10);
        data->m_addr = addr;
        data->_vptr_Data = (_func_int **)&PTR__Data_001299e0;
        CfgNode::setData(this,data);
        CFG::addNode(cfg,this);
      }
      return this;
    }
    __assertion = "addr != 0";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                ,__line,"static CfgNode *CFGReader::nodeWithAddr(CFG *, Addr)");
}

Assistant:

CfgNode* CFGReader::nodeWithAddr(CFG* cfg, Addr addr) {
	assert(cfg != 0);
	assert(addr != 0);

	CfgNode* node = cfg->nodeByAddr(addr);
	if (node == 0) {
		node = new CfgNode(CfgNode::CFG_PHANTOM);
		node->setData(new CfgNode::PhantomData(addr));
		cfg->addNode(node);
	}

	return node;
}